

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setStrAccumError(StrAccum *p,u8 eError)

{
  undefined3 in_register_00000031;
  int errCode;
  
  errCode = CONCAT31(in_register_00000031,eError);
  p->accError = eError;
  if (p->mxAlloc != 0) {
    sqlite3_str_reset(p);
  }
  if (eError == '\x12') {
    sqlite3ErrorToParser(p->db,errCode);
    return;
  }
  return;
}

Assistant:

static void setStrAccumError(StrAccum *p, u8 eError){
  assert( eError==SQLITE_NOMEM || eError==SQLITE_TOOBIG );
  p->accError = eError;
  if( p->mxAlloc ) sqlite3_str_reset(p);
  if( eError==SQLITE_TOOBIG ) sqlite3ErrorToParser(p->db, eError);
}